

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O1

void cfd::core::MergePsbtOutputItem
               (wally_psbt_output *psbt,wally_psbt_output *psbt_dest,bool ignore_duplicate_error)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t sVar2;
  size_t sVar3;
  uint8_t *puVar4;
  string local_78;
  uchar *local_58;
  string local_50;
  
  sVar2 = psbt_dest->redeem_script_len;
  if (sVar2 != 0) {
    sVar3 = psbt->redeem_script_len;
    if (sVar3 == 0) {
      puVar4 = AllocWallyBuffer(psbt_dest->redeem_script,sVar2);
      psbt->redeem_script = puVar4;
      psbt->redeem_script_len = psbt_dest->redeem_script_len;
    }
    else {
      puVar4 = psbt->redeem_script;
      local_58 = psbt_dest->redeem_script;
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_78,"txout redeem script","");
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
      ComparePsbtData(puVar4,sVar3,local_58,sVar2,&local_78,&local_50,ignore_duplicate_error);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p);
      }
    }
  }
  sVar2 = psbt_dest->witness_script_len;
  if (sVar2 != 0) {
    sVar3 = psbt->witness_script_len;
    if (sVar3 == 0) {
      puVar4 = AllocWallyBuffer(psbt_dest->witness_script,sVar2);
      psbt->witness_script = puVar4;
      psbt->witness_script_len = psbt_dest->witness_script_len;
    }
    else {
      puVar4 = psbt->witness_script;
      local_58 = psbt_dest->witness_script;
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_78,"txout witness script","");
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
      ComparePsbtData(puVar4,sVar3,local_58,sVar2,&local_78,&local_50,ignore_duplicate_error);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p);
      }
    }
  }
  paVar1 = &local_78.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"txout keypaths","");
  MergeWallyMap(&psbt->keypaths,&psbt_dest->keypaths,&local_78,ignore_duplicate_error);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  local_78._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"txout unknowns","");
  MergeWallyMap(&psbt->unknowns,&psbt_dest->unknowns,&local_78,ignore_duplicate_error);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  return;
}

Assistant:

void MergePsbtOutputItem(
    struct wally_psbt_output *psbt, const struct wally_psbt_output *psbt_dest,
    bool ignore_duplicate_error) {
  if (psbt_dest->redeem_script_len > 0) {
    if (psbt->redeem_script_len == 0) {
      psbt->redeem_script = AllocWallyBuffer(
          psbt_dest->redeem_script, psbt_dest->redeem_script_len);
      psbt->redeem_script_len = psbt_dest->redeem_script_len;
    } else {
      ComparePsbtData(
          psbt->redeem_script, psbt->redeem_script_len,
          psbt_dest->redeem_script, psbt_dest->redeem_script_len,
          "txout redeem script", "", ignore_duplicate_error);
    }
  }
  if (psbt_dest->witness_script_len > 0) {
    if (psbt->witness_script_len == 0) {
      psbt->witness_script = AllocWallyBuffer(
          psbt_dest->witness_script, psbt_dest->witness_script_len);
      psbt->witness_script_len = psbt_dest->witness_script_len;
    } else {
      ComparePsbtData(
          psbt->witness_script, psbt->witness_script_len,
          psbt_dest->witness_script, psbt_dest->witness_script_len,
          "txout witness script", "", ignore_duplicate_error);
    }
  }
  MergeWallyMap(
      &psbt->keypaths, &psbt_dest->keypaths, "txout keypaths",
      ignore_duplicate_error);
  MergeWallyMap(
      &psbt->unknowns, &psbt_dest->unknowns, "txout unknowns",
      ignore_duplicate_error);
}